

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall imrt::EvaluationFunction::generate_Z(EvaluationFunction *this,Plan *p)

{
  pointer pvVar1;
  pointer pdVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  mapped_type *__x;
  Matrix *pMVar6;
  mapped_type *ppSVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pdVar10;
  long lVar11;
  _List_node_base *this_00;
  double dVar12;
  int angle;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> beamlets;
  key_type local_78;
  _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_70;
  long local_68;
  ulong local_60;
  double local_58;
  double local_50;
  _List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  Plan::get_stations_abi_cxx11_(p);
  uVar4 = this->nb_organs;
  pvVar1 = (this->Z).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar4;
  }
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    pdVar2 = *(pointer *)
              ((long)&pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (pdVar10 = pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; pdVar10 != pdVar2; pdVar10 = pdVar10 + 1) {
      *pdVar10 = 0.0;
    }
  }
  local_70 = (_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->voxel2beamlet_list;
  uVar8 = 0;
  while ((long)uVar8 < (long)(int)uVar4) {
    local_68 = uVar8 * 0x18;
    local_60 = uVar8;
    for (lVar11 = 0;
        lVar11 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_60]; lVar11 = lVar11 + 1) {
      local_78 = (key_type)(lVar11 << 0x20 | local_60);
      __x = std::__detail::
            _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](local_70,&local_78);
      this_00 = (_List_node_base *)&local_48;
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,__x);
      dVar12 = 0.0;
      while (this_00 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            this_00 != (_List_node_base *)&local_48) {
        iVar5 = *(int *)((long)&this_00[1]._M_next + 4);
        local_78.first = *(int *)&this_00[1]._M_next;
        local_50 = dVar12;
        pMVar6 = Volume::getDepositionMatrix
                           ((this->volumes->
                            super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl
                            .super__Vector_impl_data._M_start + uVar8,*(int *)&this_00[1]._M_next);
        local_58 = pMVar6->p[lVar11][iVar5];
        ppSVar7 = std::
                  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                  ::at(&p->angle2station,&local_78.first);
        iVar5 = Station::getIntensity(*ppSVar7,iVar5);
        dVar12 = local_50 + local_58 * (double)iVar5;
      }
      lVar3 = *(long *)((long)&(((this->Z).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + local_68);
      *(double *)(lVar3 + lVar11 * 8) = dVar12 + *(double *)(lVar3 + lVar11 * 8);
      std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
                (&local_48);
    }
    uVar4 = this->nb_organs;
    uVar8 = local_60 + 1;
  }
  return;
}

Assistant:

void EvaluationFunction::generate_Z(const Plan& p){
	const list<Station*>& stations=p.get_stations();

	for(int o=0; o<nb_organs; o++)
	 	 std::fill(Z[o].begin(), Z[o].end(), 0.0);

	//we update the dose distribution matrices Z with the dose delivered by the station
	for(int o=0; o<nb_organs; o++){
		 for(int k=0; k<nb_voxels[o]; k++){
		   double dose=0.0;
			 list<pair <int,int> > beamlets = voxel2beamlet_list[make_pair(o,k)];
			 for(auto bl:beamlets){
				 int angle=bl.first; int b=bl.second;
				 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
				 dose += Dep(k,b)*p.angle2station.at(angle)->getIntensity(b);
			 }
		   Z[o][k] += dose;
		 }
	}
}